

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamepad.c
# Opt level: O1

void gamepad_event(ALLEGRO_EVENT *event)

{
  ALLEGRO_EVENT_TYPE AVar1;
  
  AVar1 = event->type;
  if (AVar1 == 1) {
    if ((long)(event->display).height < 3) {
      axis[(event->display).height] = (float)(event->display).orientation;
    }
  }
  else {
    if (AVar1 == 0x33) {
      button_down = 0;
      return;
    }
    if (AVar1 == 0x32) {
      button_down = 1;
      return;
    }
  }
  return;
}

Assistant:

void gamepad_event(ALLEGRO_EVENT *event)
{
    switch (event->type) {
        case ALLEGRO_EVENT_TOUCH_BEGIN:
            button_down = true;
            break;
            
        case ALLEGRO_EVENT_TOUCH_END:
            button_down = false;
            break;
        
        case ALLEGRO_EVENT_JOYSTICK_AXIS:
            if (event->joystick.axis < 3)
                axis[event->joystick.axis] = event->joystick.pos;
            break;
    }
}